

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luajit.c
# Opt level: O0

int report(lua_State *L,int status)

{
  int iVar1;
  char *msg_00;
  int in_ESI;
  lua_State *in_RDI;
  char *msg;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI != 0) {
    iVar1 = lua_type(in_RDI,in_ESI);
    if (iVar1 != 0) {
      msg_00 = lua_tolstring((lua_State *)msg,(int)((ulong)in_RDI >> 0x20),
                             (size_t *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
      if (msg_00 == (char *)0x0) {
        msg_00 = "(error object is not a string)";
      }
      l_message((char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),msg_00);
      lua_settop((lua_State *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                 (int)((ulong)msg_00 >> 0x20));
    }
  }
  return in_ESI;
}

Assistant:

static int report(lua_State *L, int status)
{
  if (status && !lua_isnil(L, -1)) {
    const char *msg = lua_tostring(L, -1);
    if (msg == NULL) msg = "(error object is not a string)";
    l_message(progname, msg);
    lua_pop(L, 1);
  }
  return status;
}